

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

vector<Token,_std::allocator<Token>_> * __thiscall
Tokenizer::getTokens
          (vector<Token,_std::allocator<Token>_> *__return_storage_ptr__,Tokenizer *this,
          TokenizerPosition start,TokenizerPosition end)

{
  bool bVar1;
  reference pTVar2;
  undefined1 local_98 [8];
  Token tok;
  iterator it;
  Tokenizer *this_local;
  TokenizerPosition end_local;
  TokenizerPosition start_local;
  vector<Token,_std::allocator<Token>_> *result;
  
  this_local = (Tokenizer *)end.it._M_node;
  end_local = start;
  std::vector<Token,_std::allocator<Token>_>::vector(__return_storage_ptr__);
  tok.originalText.field_2._8_8_ = end_local.it._M_node;
  while (bVar1 = std::operator!=((_Self *)((long)&tok.originalText.field_2 + 8),(_Self *)&this_local
                                ), bVar1) {
    pTVar2 = std::_List_iterator<Token>::operator*
                       ((_List_iterator<Token> *)((long)&tok.originalText.field_2 + 8));
    Token::Token((Token *)local_98,pTVar2);
    tok.column._4_1_ = 0;
    std::vector<Token,_std::allocator<Token>_>::push_back
              (__return_storage_ptr__,(value_type *)local_98);
    Token::~Token((Token *)local_98);
    std::_List_iterator<Token>::operator++
              ((_List_iterator<Token> *)((long)&tok.originalText.field_2 + 8),0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Token> Tokenizer::getTokens(TokenizerPosition start, TokenizerPosition end) const
{
	std::vector<Token> result;

	for (auto it = start.it; it != end.it; it++)
	{
		Token tok = *it;
		tok.checked = false;
		result.push_back(tok);
	}

	return result;
}